

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_pax.c
# Opt level: O3

int archive_write_pax_header_xattrs(archive_write *a,pax *pax,archive_entry *entry)

{
  char cVar1;
  char cVar2;
  wchar_t wVar3;
  wchar_t wVar4;
  byte *pbVar5;
  byte *__s;
  size_t n;
  int *piVar6;
  char *value_00;
  char *pcVar7;
  byte bVar8;
  uint uVar9;
  int iVar10;
  char *pcVar11;
  byte bVar12;
  ulong uVar13;
  long lVar14;
  int iVar15;
  byte *pbVar16;
  bool bVar17;
  size_t size;
  void *value;
  char *name;
  char *local_98;
  ulong local_60;
  char *local_58;
  byte *local_50;
  archive_string local_48;
  
  wVar3 = archive_entry_xattr_reset(entry);
  if (wVar3 != L'\0') {
    do {
      archive_entry_xattr_next(entry,(char **)&local_50,&local_58,&local_60);
      bVar12 = *local_50;
      if (bVar12 == 0) {
        pbVar5 = (byte *)malloc(1);
        __s = pbVar5;
        if (pbVar5 != (byte *)0x0) goto LAB_0015e879;
LAB_0015e8be:
        local_98 = (char *)0x0;
      }
      else {
        pbVar16 = local_50 + 1;
        iVar15 = 0;
        pbVar5 = pbVar16;
        bVar8 = bVar12;
        do {
          bVar17 = (byte)(bVar8 + 0x81) < 0xa2;
          iVar10 = bVar17 + 1 + (uint)bVar17;
          if (bVar8 == 0x25) {
            iVar10 = 3;
          }
          if (bVar8 == 0x3d) {
            iVar10 = 3;
          }
          iVar15 = iVar15 + iVar10;
          bVar8 = *pbVar5;
          pbVar5 = pbVar5 + 1;
        } while (bVar8 != 0);
        __s = (byte *)malloc((ulong)(iVar15 + 1));
        pbVar5 = __s;
        if (__s == (byte *)0x0) goto LAB_0015e8be;
        do {
          if (((((char)bVar12 < '!') || (bVar12 == 0x25)) || (bVar12 == 0x7f)) || (bVar12 == 0x3d))
          {
            *pbVar5 = 0x25;
            pbVar5[1] = "0123456789ABCDEF"[bVar12 >> 4];
            pbVar5[2] = "0123456789ABCDEF"[bVar12 & 0xf];
            pbVar5 = pbVar5 + 3;
          }
          else {
            *pbVar5 = bVar12;
            pbVar5 = pbVar5 + 1;
          }
          bVar12 = *pbVar16;
          pbVar16 = pbVar16 + 1;
        } while (bVar12 != 0);
LAB_0015e879:
        *pbVar5 = 0;
        n = strlen((char *)__s);
        wVar4 = archive_strncpy_l(&pax->l_url_encoded_name,__s,n,pax->sconv_utf8);
        free(__s);
        if (wVar4 != L'\0') {
          piVar6 = __errno_location();
          if (*piVar6 == 0xc) {
            archive_set_error(&a->archive,0xc,"Can\'t allocate memory for Linkname");
            return -0x1e;
          }
          goto LAB_0015e8be;
        }
        local_98 = (pax->l_url_encoded_name).s;
      }
      pcVar11 = local_58;
      uVar13 = local_60;
      value_00 = (char *)malloc((local_60 * 4 + 2) / 3 + 1);
      pcVar7 = value_00;
      if (value_00 != (char *)0x0) {
        for (; 2 < uVar13; uVar13 = uVar13 - 3) {
          cVar1 = *pcVar11;
          cVar2 = pcVar11[1];
          bVar12 = pcVar11[2];
          pcVar11 = pcVar11 + 3;
          *pcVar7 = base64_encode_digits[(uint)(int)cVar1 >> 2 & 0x3f];
          pcVar7[1] = base64_encode_digits
                      [(((int)cVar2 & 0xf0U) << 8 | ((int)cVar1 & 3U) << 0x10) >> 0xc];
          pcVar7[2] = base64_encode_digits[(uint)(int)CONCAT11(cVar2,bVar12) >> 6 & 0x3f];
          pcVar7[3] = base64_encode_digits[bVar12 & 0x3f];
          pcVar7 = pcVar7 + 4;
        }
        if (uVar13 == 2) {
          cVar1 = *pcVar11;
          cVar2 = pcVar11[1];
          *pcVar7 = base64_encode_digits[(uint)(int)cVar1 >> 2 & 0x3f];
          pcVar11 = pcVar7 + 2;
          pcVar7[1] = base64_encode_digits
                      [(((int)cVar2 & 0xf0U) << 8 | ((int)cVar1 & 3U) << 0x10) >> 0xc];
          uVar9 = ((int)cVar2 & 0xfU) << 2;
          lVar14 = 3;
LAB_0015e9e4:
          pcVar7 = pcVar7 + lVar14;
          *pcVar11 = base64_encode_digits[uVar9];
        }
        else if (uVar13 == 1) {
          cVar1 = *pcVar11;
          pcVar11 = pcVar7 + 1;
          *pcVar7 = base64_encode_digits[(uint)(int)cVar1 >> 2 & 0x3f];
          uVar9 = ((int)cVar1 & 3U) << 4;
          lVar14 = 2;
          goto LAB_0015e9e4;
        }
        *pcVar7 = '\0';
        if (local_98 != (char *)0x0) {
          local_48.s = (char *)0x0;
          local_48.length = 0;
          local_48.buffer_length = 0;
          archive_strncat(&local_48,"LIBARCHIVE.xattr.",0x11);
          archive_strcat(&local_48,local_98);
          add_pax_attr(&pax->pax_header,local_48.s,value_00);
          archive_string_free(&local_48);
        }
      }
      wVar3 = wVar3 + L'\xffffffff';
      free(value_00);
    } while (wVar3 != L'\0');
  }
  return 0;
}

Assistant:

static int
archive_write_pax_header_xattrs(struct archive_write *a,
    struct pax *pax, struct archive_entry *entry)
{
	struct archive_string s;
	int i = archive_entry_xattr_reset(entry);

	while (i--) {
		const char *name;
		const void *value;
		char *encoded_value;
		char *url_encoded_name = NULL, *encoded_name = NULL;
		size_t size;
		int r;

		archive_entry_xattr_next(entry, &name, &value, &size);
		url_encoded_name = url_encode(name);
		if (url_encoded_name != NULL) {
			/* Convert narrow-character to UTF-8. */
			r = archive_strcpy_l(&(pax->l_url_encoded_name),
			    url_encoded_name, pax->sconv_utf8);
			free(url_encoded_name); /* Done with this. */
			if (r == 0)
				encoded_name = pax->l_url_encoded_name.s;
			else if (errno == ENOMEM) {
				archive_set_error(&a->archive, ENOMEM,
				    "Can't allocate memory for Linkname");
				return (ARCHIVE_FATAL);
			}
		}

		encoded_value = base64_encode((const char *)value, size);

		if (encoded_name != NULL && encoded_value != NULL) {
			archive_string_init(&s);
			archive_strcpy(&s, "LIBARCHIVE.xattr.");
			archive_strcat(&s, encoded_name);
			add_pax_attr(&(pax->pax_header), s.s, encoded_value);
			archive_string_free(&s);
		}
		free(encoded_value);
	}
	return (ARCHIVE_OK);
}